

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O0

void put16bitbwtile(TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
                   int32_t fromskew,int32_t toskew,uchar *pp)

{
  ushort uVar1;
  uint32_t **ppuVar2;
  ushort *local_40;
  uint16_t *wp;
  uint32_t **BWmap;
  uint32_t local_28;
  int samplesperpixel;
  uint32_t h_local;
  uint32_t w_local;
  uint32_t y_local;
  uint32_t x_local;
  uint32_t *cp_local;
  TIFFRGBAImage *img_local;
  
  uVar1 = img->samplesperpixel;
  ppuVar2 = img->BWmap;
  _y_local = cp;
  for (local_28 = h; local_28 != 0; local_28 = local_28 - 1) {
    local_40 = (ushort *)pp;
    for (w_local = w; w_local != 0; w_local = w_local - 1) {
      *_y_local = *ppuVar2[(int)(uint)*local_40 >> 8];
      pp = pp + (int)((uint)uVar1 << 1);
      local_40 = local_40 + (int)(uint)uVar1;
      _y_local = _y_local + 1;
    }
    _y_local = _y_local + toskew;
    pp = pp + fromskew;
  }
  return;
}

Assistant:

DECLAREContigPutFunc(put16bitbwtile)
{
    int samplesperpixel = img->samplesperpixel;
    uint32_t **BWmap = img->BWmap;

    (void)y;
    for (; h > 0; --h)
    {
        uint16_t *wp = (uint16_t *)pp;

        for (x = w; x > 0; --x)
        {
            /* use high order byte of 16bit value */

            *cp++ = BWmap[*wp >> 8][0];
            pp += 2 * samplesperpixel;
            wp += samplesperpixel;
        }
        cp += toskew;
        pp += fromskew;
    }
}